

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

bool Js::VarIsImpl<Js::JavascriptPromiseThunkFinallyFunction>(RecyclableObject *obj)

{
  _func_int **pp_Var1;
  bool bVar2;
  
  bVar2 = VarIsImpl<Js::JavascriptFunction>(obj);
  if (bVar2) {
    pp_Var1 = (obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject;
    bVar2 = true;
    if (pp_Var1 !=
        (_func_int **)VirtualTableInfo<Js::JavascriptPromiseThunkFinallyFunction>::Address) {
      bVar2 = pp_Var1 ==
              (_func_int **)
              VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptPromiseThunkFinallyFunction>_>::
              Address;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool VarIsImpl<JavascriptPromiseThunkFinallyFunction>(RecyclableObject* obj)
    {
        if (VarIs<JavascriptFunction>(obj))
        {
            return VirtualTableInfo<JavascriptPromiseThunkFinallyFunction>::HasVirtualTable(obj)
                || VirtualTableInfo<CrossSiteObject<JavascriptPromiseThunkFinallyFunction>>::HasVirtualTable(obj);
        }
        return false;
    }